

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O2

void p2sc_dctm(double *m,int N)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double __x;
  double dVar8;
  
  __x = (double)N;
  dVar8 = SQRT(__x);
  dVar7 = dVar8;
  if (__x < 0.0) {
    dVar7 = sqrt(__x);
    dVar8 = sqrt(__x);
  }
  uVar1 = 0;
  uVar2 = 0;
  if (0 < N) {
    uVar2 = (ulong)(uint)N;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    m[uVar1] = 1.0 / dVar7;
  }
  lVar6 = (long)N;
  pdVar3 = m + lVar6;
  for (lVar5 = 1; lVar5 < lVar6; lVar5 = lVar5 + 1) {
    for (lVar4 = 0; (ulong)(uint)N * 2 != lVar4; lVar4 = lVar4 + 2) {
      dVar7 = cos(((double)((int)lVar4 + 1) * 3.141592653589793 * (double)(int)lVar5) /
                  (double)(N * 2));
      *(double *)((long)pdVar3 + lVar4 * 4) = dVar7 * (1.4142135623730951 / dVar8);
    }
    pdVar3 = pdVar3 + lVar6;
  }
  return;
}

Assistant:

void p2sc_dctm(double *m, int N) {
    int i, j;
    double s1 = 1 / sqrt(N), s2 = M_SQRT2 / sqrt(N);

    for (i = 0; i < N; ++i)
        m[i] = s1;
    for (j = 1; j < N; ++j)
        for (i = 0; i < N; ++i)
            m[j * N + i] = s2 * cos(M_PI * (2 * i + 1) * j / (2 * N));
}